

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionPrintfInfo
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint uVar2;
  Op OVar3;
  long lVar4;
  char *pcVar5;
  size_t index;
  DiagnosticStream DStack_1f8;
  
  uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,4);
  bVar1 = IsUint32Constant(_,uVar2);
  if (bVar1) {
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    OVar3 = ValidationState_t::GetIdOpcode(_,uVar2);
    if (OVar3 == OpString) {
      if ((ulong)((long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(inst->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x61) {
        return SPV_SUCCESS;
      }
      index = 6;
      while( true ) {
        uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,index);
        bVar1 = IsUint32Constant(_,uVar2);
        if (!bVar1) break;
        index = index + 1;
        if ((ulong)((long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(inst->operands_).
                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= index) {
          return SPV_SUCCESS;
        }
      }
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
      pcVar5 = "ArgumentSizes must be a 32-bit unsigned integer OpConstant";
      lVar4 = 0x3a;
    }
    else {
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
      pcVar5 = "FormatString must be an OpString";
      lVar4 = 0x20;
    }
  }
  else {
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
    pcVar5 = "PrintfID must be a 32-bit unsigned integer OpConstant";
    lVar4 = 0x35;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,pcVar5,lVar4);
  DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  return DStack_1f8.error_;
}

Assistant:

spv_result_t ValidateClspvReflectionPrintfInfo(ValidationState_t& _,
                                               const Instruction* inst) {
  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(4))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "PrintfID must be a 32-bit unsigned integer OpConstant";
  }

  if (_.GetIdOpcode(inst->GetOperandAs<uint32_t>(5)) != spv::Op::OpString) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "FormatString must be an OpString";
  }

  for (size_t i = 6; i < inst->operands().size(); ++i) {
    if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(i))) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "ArgumentSizes must be a 32-bit unsigned integer OpConstant";
    }
  }

  return SPV_SUCCESS;
}